

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

difference_type
QtPrivate::
sequential_erase_if<QList<QModelIndex>,QAbstractItemViewPrivate::selectedDraggableIndexes()const::__0>
          (QList<QModelIndex> *c,anon_class_8_1_8991fb9c_for__M_pred *pred)

{
  int iVar1;
  bool bVar2;
  QList<QModelIndex> *this;
  QList<QModelIndex> *pQVar3;
  difference_type dVar4;
  iterator *this_00;
  QModelIndex *pQVar5;
  QModelIndex *in_RSI;
  QList<QModelIndex> *in_RDI;
  long in_FS_OFFSET;
  difference_type result;
  iterator dest;
  iterator it;
  iterator e;
  const_iterator t_it;
  const_iterator cend;
  const_iterator cbegin;
  QModelIndex *in_stack_ffffffffffffff08;
  iterator in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff28;
  anon_class_8_1_8991fb9c_for__M_pred in_stack_ffffffffffffff38;
  const_iterator in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff60;
  iterator abegin;
  const_iterator local_90;
  QModelIndex *local_88;
  const_iterator local_80;
  QModelIndex *local_78;
  QModelIndex *local_70;
  QModelIndex *local_68;
  iterator local_60;
  iterator local_58;
  iterator local_50;
  QModelIndex *local_48;
  QModelIndex *local_40;
  undefined8 local_38;
  QModelIndex *local_30;
  QModelIndex *local_28;
  QModelIndex *local_20;
  QModelIndex *local_18;
  QModelIndex *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QModelIndex *)QList<QModelIndex>::cbegin(in_stack_ffffffffffffff10.i);
  local_18 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = (QModelIndex *)QList<QModelIndex>::cend(in_stack_ffffffffffffff10.i);
  local_20 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = local_10;
  local_38._0_4_ = in_RSI->r;
  local_38._4_4_ = in_RSI->c;
  local_18 = local_30;
  local_48 = (QModelIndex *)
             std::
             find_if<QList<QModelIndex>::const_iterator,QAbstractItemViewPrivate::selectedDraggableIndexes()const::__0>
                       (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                        in_stack_ffffffffffffff38);
  local_40 = local_10;
  local_20 = local_48;
  this = (QList<QModelIndex> *)
         std::distance<QList<QModelIndex>::const_iterator>
                   ((const_iterator)in_stack_ffffffffffffff28.i,
                    (const_iterator)in_stack_ffffffffffffff20.i);
  pQVar3 = (QList<QModelIndex> *)QList<QModelIndex>::size(in_RDI);
  if (this == pQVar3) {
    dVar4 = 0;
  }
  else {
    local_50.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<QModelIndex>::end(in_stack_ffffffffffffff10.i);
    local_58.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::begin((QList<QModelIndex> *)in_stack_ffffffffffffff10.i);
    local_60 = std::next<QList<QModelIndex>::iterator>
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_58 = local_60;
    while( true ) {
      this_00 = QList<QModelIndex>::iterator::operator++(&local_58);
      local_68 = local_50.i;
      bVar2 = QList<QModelIndex>::iterator::operator!=(this_00,local_50);
      if (!bVar2) break;
      in_stack_ffffffffffffff28.i = in_RSI;
      QList<QModelIndex>::iterator::operator*(&local_58);
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qabstractitemview.cpp:4768:29)>
              ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                        ((anon_class_8_1_8991fb9c_for__M_pred *)in_stack_ffffffffffffff10.i,
                         in_stack_ffffffffffffff08);
      if (!bVar2) {
        in_stack_ffffffffffffff20.i = QList<QModelIndex>::iterator::operator*(&local_58);
        pQVar5 = QList<QModelIndex>::iterator::operator*(&local_60);
        iVar1 = (in_stack_ffffffffffffff20.i)->c;
        pQVar5->r = (in_stack_ffffffffffffff20.i)->r;
        pQVar5->c = iVar1;
        pQVar5->i = (in_stack_ffffffffffffff20.i)->i;
        (pQVar5->m).ptr = ((in_stack_ffffffffffffff20.i)->m).ptr;
        QList<QModelIndex>::iterator::operator++(&local_60);
      }
    }
    local_70 = local_60.i;
    local_78 = local_50.i;
    dVar4 = std::distance<QList<QModelIndex>::iterator>
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    local_88 = local_60.i;
    QList<QModelIndex>::const_iterator::const_iterator(&local_80,local_60);
    abegin.i = local_50.i;
    QList<QModelIndex>::const_iterator::const_iterator(&local_90,local_50);
    QList<QModelIndex>::erase(this,(const_iterator)abegin.i,in_stack_ffffffffffffff60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return dVar4;
}

Assistant:

auto sequential_erase_if(Container &c, Predicate &pred)
{
    // This is remove_if() modified to perform the find_if step on
    // const_iterators to avoid shared container detaches if nothing needs to
    // be removed. We cannot run remove_if after find_if: doing so would apply
    // the predicate to the first matching element twice!

    const auto cbegin = c.cbegin();
    const auto cend = c.cend();
    const auto t_it = std::find_if(cbegin, cend, pred);
    auto result = std::distance(cbegin, t_it);
    if (result == c.size())
        return result - result; // `0` of the right type

    // now detach:
    const auto e = c.end();

    auto it = std::next(c.begin(), result);
    auto dest = it;

    // Loop Invariants:
    // - it != e
    // - [next(it), e[ still to be checked
    // - [c.begin(), dest[ are result
    while (++it != e) {
        if (!pred(*it)) {
            *dest = std::move(*it);
            ++dest;
        }
    }

    result = std::distance(dest, e);
    c.erase(dest, e);
    return result;
}